

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O0

err_t cmdCVCsPrint(octet *certs,size_t certs_len)

{
  err_t eVar1;
  blob_t pvVar2;
  long in_RSI;
  size_t len;
  btok_cvc_t *cvc;
  void *stack;
  err_t code;
  size_t in_stack_00000038;
  octet *in_stack_00000040;
  size_t in_stack_00000048;
  octet *in_stack_00000050;
  btok_cvc_t *in_stack_00000058;
  octet *in_stack_ffffffffffffffc8;
  err_t local_1c;
  long local_18;
  
  pvVar2 = blobCreate((size_t)in_stack_ffffffffffffffc8);
  local_1c = 0x6e;
  local_18 = in_RSI;
  if (pvVar2 != (blob_t)0x0) {
    local_1c = 0;
  }
  while( true ) {
    if (local_18 == 0) {
      blobClose((blob_t)0x104df2);
      return local_1c;
    }
    in_stack_ffffffffffffffc8 = (octet *)btokCVCLen(in_stack_ffffffffffffffc8,0x104cc7);
    if (in_stack_ffffffffffffffc8 == (octet *)0xffffffffffffffff) {
      local_1c = 0x204;
    }
    else {
      local_1c = btokCVCUnwrap(in_stack_00000058,in_stack_00000050,in_stack_00000048,
                               in_stack_00000040,in_stack_00000038);
    }
    if (local_1c != 0) {
      blobClose((blob_t)0x104d0c);
      return local_1c;
    }
    printf("  %s (%u bits, issued by %s, ",(long)pvVar2 + 0xd,
           (ulong)(uint)((int)*(undefined8 *)((long)pvVar2 + 0xa0) << 1),pvVar2);
    eVar1 = cmdPrintDate(in_stack_ffffffffffffffc8);
    if (eVar1 != 0) {
      blobClose((blob_t)0x104d6b);
      return eVar1;
    }
    printf("-");
    eVar1 = cmdPrintDate(in_stack_ffffffffffffffc8);
    if (eVar1 != 0) break;
    printf(")\n");
    local_18 = local_18 - (long)in_stack_ffffffffffffffc8;
    local_1c = 0;
  }
  blobClose((blob_t)0x104dac);
  return eVar1;
}

Assistant:

err_t cmdCVCsPrint(const octet* certs, size_t certs_len)
{
	err_t code;
	void* stack;
	btok_cvc_t* cvc;
	// pre
	ASSERT(memIsValid(certs, certs_len));
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(btok_cvc_t));
	cvc = (btok_cvc_t*)stack;
	// цикл по сертификатам
	while (certs_len)
	{
		// разобрать сертификат
		size_t len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			code = ERR_BAD_CERTRING;
		else
			code = btokCVCUnwrap(cvc, certs, len, 0, 0);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// печатать
		printf("  %s (%u bits, issued by %s, ",
			cvc->holder, (unsigned)cvc->pubkey_len * 2, cvc->authority);
		code = cmdPrintDate(cvc->from);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		printf("-");
		code = cmdPrintDate(cvc->until);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		printf(")\n");
		// к следующему
		certs += len, certs_len -= len;
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}